

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O1

int __thiscall
anurbs::NurbsSurfaceGeometry<3L>::clone
          (NurbsSurfaceGeometry<3L> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...
          )

{
  undefined8 *puVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool local_59;
  long *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = (**(code **)(*(long *)__fn + 0x10))(__fn,__fn,__child_stack,___flags);
  local_40 = (**(code **)(*(long *)__fn + 0x18))(__fn);
  lVar7 = *(long *)(__fn + 0x30);
  lVar6 = (**(code **)(*(long *)__fn + 0x10))(__fn);
  local_48 = (lVar7 - lVar6) + 1;
  lVar7 = *(long *)(__fn + 0x40);
  lVar6 = (**(code **)(*(long *)__fn + 0x18))(__fn);
  local_50 = (lVar7 - lVar6) + 1;
  local_59 = *(long *)(__fn + 0x60) != 0;
  new_<anurbs::NurbsSurfaceGeometry<3l>,long,long,long,long,bool>
            ((anurbs *)&local_58,&local_38,&local_40,&local_48,&local_50,&local_59);
  std::__shared_ptr<anurbs::NurbsSurfaceGeometry<3l>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<anurbs::NurbsSurfaceGeometry<3l>,std::default_delete<anurbs::NurbsSurfaceGeometry<3l>>,void>
            ((__shared_ptr<anurbs::NurbsSurfaceGeometry<3l>,(__gnu_cxx::_Lock_policy)2> *)this,
             (unique_ptr<anurbs::NurbsSurfaceGeometry<3L>,_std::default_delete<anurbs::NurbsSurfaceGeometry<3L>_>_>
              *)&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  lVar7 = *(long *)(__fn + 0x30);
  if (0 < lVar7) {
    pp_Var3 = (this->super_SurfaceBase<3L>)._vptr_SurfaceBase;
    lVar6 = *(long *)(__fn + 0x28);
    lVar8 = 0;
    do {
      if ((long)pp_Var3[6] <= lVar8) goto LAB_0029cad9;
      *(undefined8 *)(pp_Var3[5] + lVar8 * 8) = *(undefined8 *)(lVar6 + lVar8 * 8);
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  lVar7 = *(long *)(__fn + 0x40);
  if (0 < lVar7) {
    pp_Var3 = (this->super_SurfaceBase<3L>)._vptr_SurfaceBase;
    lVar6 = *(long *)(__fn + 0x38);
    lVar8 = 0;
    do {
      if ((long)pp_Var3[8] <= lVar8) goto LAB_0029cad9;
      *(undefined8 *)(pp_Var3[7] + lVar8 * 8) = *(undefined8 *)(lVar6 + lVar8 * 8);
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  lVar7 = *(long *)(__fn + 0x50);
  if (0 < lVar7) {
    lVar6 = 0x10;
    lVar8 = 0;
    do {
      pp_Var3 = (this->super_SurfaceBase<3L>)._vptr_SurfaceBase;
      if ((long)pp_Var3[10] <= lVar8) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, 3>, 1, 3, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, 3>, BlockRows = 1, BlockCols = 3, InnerPanel = true]"
                     );
      }
      lVar7 = *(long *)(__fn + 0x48);
      p_Var4 = pp_Var3[9];
      puVar1 = (undefined8 *)(lVar7 + -0x10 + lVar6);
      uVar5 = puVar1[1];
      p_Var2 = p_Var4 + lVar6 + -0x10;
      *(undefined8 *)p_Var2 = *puVar1;
      *(undefined8 *)(p_Var2 + 8) = uVar5;
      *(undefined8 *)(p_Var4 + lVar6) = *(undefined8 *)(lVar7 + lVar6);
      lVar8 = lVar8 + 1;
      lVar7 = *(long *)(__fn + 0x50);
      lVar6 = lVar6 + 0x18;
    } while (lVar8 < lVar7);
  }
  if (0 < lVar7 && *(long *)(__fn + 0x60) != 0) {
    pp_Var3 = (this->super_SurfaceBase<3L>)._vptr_SurfaceBase;
    lVar6 = *(long *)(__fn + 0x58);
    lVar8 = 0;
    do {
      if ((*(long *)(__fn + 0x60) <= lVar8) || ((long)pp_Var3[0xc] <= lVar8)) {
LAB_0029cad9:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x198,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      *(undefined8 *)(pp_Var3[0xb] + lVar8 * 8) = *(undefined8 *)(lVar6 + lVar8 * 8);
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  return (int)this;
}

Assistant:

Pointer<Type> clone()
    {
        Pointer<Type> clone = new_<Type>(
            this->degree_u(), this->degree_v(), this->nb_poles_u(),
            this->nb_poles_v(), this->is_rational());

        for (Index i = 0; i < this->nb_knots_u(); i++) {
            clone->knot_u(i) = this->knot_u(i);
        }

        for (Index i = 0; i < this->nb_knots_v(); i++) {
            clone->knot_v(i) = this->knot_v(i);
        }

        for (Index i = 0; i < this->nb_poles(); i++) {
            clone->pole(i) = this->pole(i);
        }

        if (this->is_rational()) {
            for (Index i = 0; i < this->nb_poles(); i++) {
                clone->weight(i) = this->weight(i);
            }
        }

        return clone;
    }